

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rdopt.c
# Opt level: O3

void analyze_single_states(AV1_COMP *cpi,InterModeSearchState *search_state)

{
  char cVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  bool bVar5;
  long lVar6;
  int iVar7;
  ulong uVar8;
  bool bVar9;
  int *piVar10;
  int *piVar11;
  ulong uVar12;
  int prune_factor;
  long lVar13;
  long lVar14;
  long lVar15;
  ulong uVar16;
  long lVar17;
  MV_REFERENCE_FRAME (*paaMVar18) [4] [4];
  long lVar19;
  
  lVar13 = (ulong)(1 < (int)cpi) + 5;
  lVar6 = 0;
  bVar5 = true;
  do {
    bVar9 = bVar5;
    lVar15 = search_state->single_state[lVar6][2][0].rd;
    lVar19 = search_state->single_state[lVar6][3][0].rd;
    if (lVar19 < lVar15) {
      lVar15 = lVar19;
    }
    piVar10 = &search_state->single_state[lVar6][0][1].valid;
    lVar19 = 0;
    do {
      iVar7 = search_state->single_state_cnt[lVar6][lVar19];
      if (1 < iVar7) {
        lVar17 = 1;
        piVar11 = piVar10;
        do {
          if ((((SingleInterModeState *)(piVar11 + -3))->rd != 0x7fffffffffffffff) &&
             (lVar14 = (((SingleInterModeState *)(piVar11 + -3))->rd >> 3) * lVar13,
             lVar14 - lVar15 != 0 && lVar15 <= lVar14)) {
            *piVar11 = 0;
            iVar7 = search_state->single_state_cnt[lVar6][lVar19];
          }
          lVar17 = lVar17 + 1;
          piVar11 = piVar11 + 4;
        } while (lVar17 < iVar7);
      }
      lVar19 = lVar19 + 1;
      piVar10 = piVar10 + 0x10;
    } while (lVar19 != 4);
    lVar15 = search_state->single_state_modelled[lVar6][2][0].rd;
    lVar19 = search_state->single_state_modelled[lVar6][3][0].rd;
    if (lVar19 < lVar15) {
      lVar15 = lVar19;
    }
    piVar10 = &search_state->single_state_modelled[lVar6][0][1].valid;
    lVar19 = 0;
    do {
      iVar7 = search_state->single_state_modelled_cnt[lVar6][lVar19];
      if (1 < iVar7) {
        lVar17 = 1;
        piVar11 = piVar10;
        do {
          if ((((SingleInterModeState *)(piVar11 + -3))->rd != 0x7fffffffffffffff) &&
             (lVar14 = (((SingleInterModeState *)(piVar11 + -3))->rd >> 3) * lVar13,
             lVar14 - lVar15 != 0 && lVar15 <= lVar14)) {
            *piVar11 = 0;
            iVar7 = search_state->single_state_modelled_cnt[lVar6][lVar19];
          }
          lVar17 = lVar17 + 1;
          piVar11 = piVar11 + 4;
        } while (lVar17 < iVar7);
      }
      lVar19 = lVar19 + 1;
      piVar10 = piVar10 + 0x10;
    } while (lVar19 != 4);
    lVar6 = 1;
    bVar5 = false;
  } while (bVar9);
  lVar6 = 0;
  bVar5 = true;
  do {
    piVar10 = &search_state->single_state[lVar6][0][0].valid;
    paaMVar18 = search_state->single_rd_order + lVar6;
    lVar13 = 0;
    do {
      uVar2 = search_state->single_state_cnt[lVar6][lVar13];
      uVar3 = search_state->single_state_modelled_cnt[lVar6][lVar13];
      uVar4 = uVar3;
      if ((int)uVar3 < (int)uVar2) {
        uVar4 = uVar2;
      }
      if ((int)uVar2 < 1) {
        uVar8 = 0;
      }
      else {
        lVar15 = 0;
        uVar8 = 0;
        do {
          if (*(long *)((long)piVar10 + lVar15 + -0xc) == 0x7fffffffffffffff) break;
          if (*(int *)((long)piVar10 + lVar15) != 0) {
            iVar7 = (int)uVar8;
            uVar8 = (ulong)(iVar7 + 1);
            search_state->single_rd_order[lVar6][lVar13][iVar7] =
                 *(MV_REFERENCE_FRAME *)((long)piVar10 + lVar15 + -4);
          }
          lVar15 = lVar15 + 0x10;
        } while ((ulong)uVar2 << 4 != lVar15);
      }
      if (((int)uVar8 < (int)uVar4) && (0 < (int)uVar3)) {
        uVar12 = 0;
        while (search_state->single_state_modelled[lVar6][lVar13][uVar12].rd != 0x7fffffffffffffff)
        {
          if (search_state->single_state_modelled[lVar6][lVar13][uVar12].valid != 0) {
            cVar1 = search_state->single_state_modelled[lVar6][lVar13][uVar12].ref_frame;
            iVar7 = (int)uVar8;
            if (0 < iVar7) {
              uVar16 = 0;
              do {
                if ((*paaMVar18)[0][uVar16] == cVar1) goto LAB_00214e5a;
                uVar16 = uVar16 + 1;
              } while (uVar8 != uVar16);
            }
            if (0 < (int)uVar2) {
              lVar15 = 0;
              do {
                if (cVar1 == *(char *)((long)piVar10 + lVar15 + -4)) {
                  if (*(int *)((long)piVar10 + lVar15) == 0) goto LAB_00214e5a;
                  break;
                }
                lVar15 = lVar15 + 0x10;
              } while ((ulong)uVar2 << 4 != lVar15);
            }
            uVar8 = (ulong)(iVar7 + 1);
            search_state->single_rd_order[lVar6][lVar13][iVar7] = cVar1;
          }
LAB_00214e5a:
          uVar12 = uVar12 + 1;
          if ((uVar3 <= uVar12) || ((int)uVar4 <= (int)uVar8)) break;
        }
      }
      lVar13 = lVar13 + 1;
      piVar10 = piVar10 + 0x10;
      paaMVar18 = (MV_REFERENCE_FRAME (*) [4] [4])(*paaMVar18 + 1);
    } while (lVar13 != 4);
    lVar6 = 1;
    bVar9 = !bVar5;
    bVar5 = false;
    if (bVar9) {
      return;
    }
  } while( true );
}

Assistant:

static inline void analyze_single_states(const AV1_COMP *cpi,
                                         InterModeSearchState *search_state) {
  const int prune_level = cpi->sf.inter_sf.prune_comp_search_by_single_result;
  assert(prune_level >= 1);
  int i, j, dir, mode;

  for (dir = 0; dir < 2; ++dir) {
    int64_t best_rd;
    SingleInterModeState(*state)[FWD_REFS];
    const int prune_factor = prune_level >= 2 ? 6 : 5;

    // Use the best rd of GLOBALMV or NEWMV to prune the unlikely
    // reference frames for all the modes (NEARESTMV and NEARMV may not
    // have same motion vectors). Always keep the best of each mode
    // because it might form the best possible combination with other mode.
    state = search_state->single_state[dir];
    best_rd = AOMMIN(state[INTER_OFFSET(NEWMV)][0].rd,
                     state[INTER_OFFSET(GLOBALMV)][0].rd);
    for (mode = 0; mode < SINGLE_INTER_MODE_NUM; ++mode) {
      for (i = 1; i < search_state->single_state_cnt[dir][mode]; ++i) {
        if (state[mode][i].rd != INT64_MAX &&
            (state[mode][i].rd >> 3) * prune_factor > best_rd) {
          state[mode][i].valid = 0;
        }
      }
    }

    state = search_state->single_state_modelled[dir];
    best_rd = AOMMIN(state[INTER_OFFSET(NEWMV)][0].rd,
                     state[INTER_OFFSET(GLOBALMV)][0].rd);
    for (mode = 0; mode < SINGLE_INTER_MODE_NUM; ++mode) {
      for (i = 1; i < search_state->single_state_modelled_cnt[dir][mode]; ++i) {
        if (state[mode][i].rd != INT64_MAX &&
            (state[mode][i].rd >> 3) * prune_factor > best_rd) {
          state[mode][i].valid = 0;
        }
      }
    }
  }

  // Ordering by simple rd first, then by modelled rd
  for (dir = 0; dir < 2; ++dir) {
    for (mode = 0; mode < SINGLE_INTER_MODE_NUM; ++mode) {
      const int state_cnt_s = search_state->single_state_cnt[dir][mode];
      const int state_cnt_m =
          search_state->single_state_modelled_cnt[dir][mode];
      SingleInterModeState *state_s = search_state->single_state[dir][mode];
      SingleInterModeState *state_m =
          search_state->single_state_modelled[dir][mode];
      int count = 0;
      const int max_candidates = AOMMAX(state_cnt_s, state_cnt_m);
      for (i = 0; i < state_cnt_s; ++i) {
        if (state_s[i].rd == INT64_MAX) break;
        if (state_s[i].valid) {
          search_state->single_rd_order[dir][mode][count++] =
              state_s[i].ref_frame;
        }
      }
      if (count >= max_candidates) continue;

      for (i = 0; i < state_cnt_m && count < max_candidates; ++i) {
        if (state_m[i].rd == INT64_MAX) break;
        if (!state_m[i].valid) continue;
        const int ref_frame = state_m[i].ref_frame;
        int match = 0;
        // Check if existing already
        for (j = 0; j < count; ++j) {
          if (search_state->single_rd_order[dir][mode][j] == ref_frame) {
            match = 1;
            break;
          }
        }
        if (match) continue;
        // Check if this ref_frame is removed in simple rd
        int valid = 1;
        for (j = 0; j < state_cnt_s; ++j) {
          if (ref_frame == state_s[j].ref_frame) {
            valid = state_s[j].valid;
            break;
          }
        }
        if (valid) {
          search_state->single_rd_order[dir][mode][count++] = ref_frame;
        }
      }
    }
  }
}